

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeTestsUtil.cpp
# Opt level: O2

VkBufferImageCopy * __thiscall
vkt::compute::makeBufferImageCopy
          (VkBufferImageCopy *__return_storage_ptr__,compute *this,VkExtent3D extent,
          deUint32 arraySize)

{
  long lVar1;
  
  lVar1 = (ulong)extent.depth << 0x20;
  __return_storage_ptr__->bufferOffset = 0;
  __return_storage_ptr__->bufferRowLength = 0;
  __return_storage_ptr__->bufferImageHeight = 0;
  (__return_storage_ptr__->imageSubresource).aspectMask = 1;
  (__return_storage_ptr__->imageSubresource).mipLevel = 0;
  (__return_storage_ptr__->imageSubresource).baseArrayLayer = (int)lVar1;
  (__return_storage_ptr__->imageSubresource).layerCount = (int)((ulong)lVar1 >> 0x20);
  (__return_storage_ptr__->imageOffset).x = 0;
  (__return_storage_ptr__->imageOffset).y = 0;
  (__return_storage_ptr__->imageOffset).z = 0;
  *(compute **)&__return_storage_ptr__->imageExtent = this;
  (__return_storage_ptr__->imageExtent).depth = extent.width;
  return __return_storage_ptr__;
}

Assistant:

VkBufferImageCopy makeBufferImageCopy (const VkExtent3D extent,
									   const deUint32	arraySize)
{
	const VkBufferImageCopy copyParams =
	{
		0ull,																		//	VkDeviceSize				bufferOffset;
		0u,																			//	deUint32					bufferRowLength;
		0u,																			//	deUint32					bufferImageHeight;
		makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, arraySize),	//	VkImageSubresourceLayers	imageSubresource;
		makeOffset3D(0, 0, 0),														//	VkOffset3D					imageOffset;
		extent,																		//	VkExtent3D					imageExtent;
	};
	return copyParams;
}